

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_row_mt_alloc(AV1DecRowMTSync *dec_row_mt_sync,AV1_COMMON *cm,int rows)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i;
  int local_18;
  
  *(int *)(in_RDI + 2) = in_EDX;
  pvVar2 = aom_malloc(0x1bb3ac);
  *in_RDI = (long)pvVar2;
  if (*in_RDI == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate dec_row_mt_sync->mutex_");
  }
  if (*in_RDI != 0) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      pthread_mutex_init((pthread_mutex_t *)(*in_RDI + (long)local_18 * 0x28),
                         (pthread_mutexattr_t *)0x0);
    }
  }
  pvVar2 = aom_malloc(0x1bb434);
  in_RDI[1] = (long)pvVar2;
  if (in_RDI[1] == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate dec_row_mt_sync->cond_");
  }
  if (in_RDI[1] != 0) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      pthread_cond_init((pthread_cond_t *)(in_RDI[1] + (long)local_18 * 0x30),
                        (pthread_condattr_t *)0x0);
    }
  }
  pvVar2 = aom_malloc(0x1bb4c0);
  in_RDI[3] = (long)pvVar2;
  if (in_RDI[3] == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate dec_row_mt_sync->cur_sb_col");
  }
  iVar1 = get_sync_range(*(int *)(in_RSI + 0x38));
  *(int *)(in_RDI + 4) = iVar1;
  return;
}

Assistant:

static inline void dec_row_mt_alloc(AV1DecRowMTSync *dec_row_mt_sync,
                                    AV1_COMMON *cm, int rows) {
  dec_row_mt_sync->allocated_sb_rows = rows;
#if CONFIG_MULTITHREAD
  {
    int i;

    CHECK_MEM_ERROR(cm, dec_row_mt_sync->mutex_,
                    aom_malloc(sizeof(*(dec_row_mt_sync->mutex_)) * rows));
    if (dec_row_mt_sync->mutex_) {
      for (i = 0; i < rows; ++i) {
        pthread_mutex_init(&dec_row_mt_sync->mutex_[i], NULL);
      }
    }

    CHECK_MEM_ERROR(cm, dec_row_mt_sync->cond_,
                    aom_malloc(sizeof(*(dec_row_mt_sync->cond_)) * rows));
    if (dec_row_mt_sync->cond_) {
      for (i = 0; i < rows; ++i) {
        pthread_cond_init(&dec_row_mt_sync->cond_[i], NULL);
      }
    }
  }
#endif  // CONFIG_MULTITHREAD

  CHECK_MEM_ERROR(cm, dec_row_mt_sync->cur_sb_col,
                  aom_malloc(sizeof(*(dec_row_mt_sync->cur_sb_col)) * rows));

  // Set up nsync.
  dec_row_mt_sync->sync_range = get_sync_range(cm->width);
}